

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_event_samples.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  ostream *poVar3;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [32];
  undefined4 local_4f0;
  allocator local_4e9;
  string local_4e8 [32];
  istream local_4c8 [8];
  ifstream input;
  string local_2c0 [8];
  string urn;
  allocator local_289;
  string local_288 [8];
  string out_file;
  ingest_event_stream ingest_stream;
  char **argv_local;
  int argc_local;
  
  event_track::ingest_event_stream::ingest_event_stream
            ((ingest_event_stream *)((long)&out_file.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"out_mpd_event.mpd",&local_289);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::string(local_2c0);
  if (argc < 2) {
    print_info();
    local_4f0 = 1;
  }
  else {
    std::ifstream::ifstream(local_4c8,argv[1],_S_bin);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"failed loading input file: ");
      pcVar1 = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8,pcVar1,&local_4e9);
      poVar3 = std::operator<<(poVar3,local_4e8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      print_info();
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout," reading input file: ");
      pcVar1 = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_510,pcVar1,&local_511);
      poVar3 = std::operator<<(poVar3,local_510);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      if (2 < argc) {
        pcVar1 = argv[2];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_538,pcVar1,&local_539);
        std::__cxx11::string::operator=(local_288,local_538);
        std::__cxx11::string::~string(local_538);
        std::allocator<char>::~allocator((allocator<char> *)&local_539);
      }
      event_track::ingest_event_stream::print_samples_from_file
                ((ingest_event_stream *)((long)&out_file.field_2 + 8),local_4c8,false);
      std::ifstream::close();
    }
    local_4f0 = 1;
    std::ifstream::~ifstream(local_4c8);
  }
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_288);
  event_track::ingest_event_stream::~ingest_event_stream
            ((ingest_event_stream *)((long)&out_file.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{

	event_track::ingest_event_stream ingest_stream;
	string out_file = "out_mpd_event.mpd";
	string urn;

	if (argc > 1)
	{

		ifstream input(argv[1], ifstream::binary);

		if (!input.good())
		{
			cout << "failed loading input file: " << string(argv[1]) << endl;
			print_info();
			return 0;
		}

		cout << " reading input file: " << string(argv[1]) << std::endl;

		if (argc > 2) 
			out_file = string(argv[2]);

		// cmfv, cmfa files containing emsg boxes 
		ingest_stream.print_samples_from_file(input, false);
		input.close();

		return 0;
	}
	else
	{
		print_info();
	}

	return 0;
}